

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall mario::EPoller::update(EPoller *this,int operation,Channel *channel)

{
  int __fd;
  byte bVar1;
  int iVar2;
  Writer *pWVar3;
  undefined1 local_9c [12];
  Writer local_90;
  
  local_9c._0_4_ = channel->_events;
  __fd = channel->_fd;
  local_9c._4_8_ = channel;
  iVar2 = epoll_ctl(this->_epollfd,operation,__fd,(epoll_event *)local_9c);
  if (iVar2 < 0) {
    local_90._vptr_Writer = (_func_int **)&PTR__Writer_00134bd0;
    local_90.m_msg = (LogMessage *)0x0;
    local_90.m_level = Fatal;
    local_90.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
    ;
    local_90.m_line = 99;
    local_90.m_func = "void mario::EPoller::update(int, Channel *)";
    local_90.m_verboseLevel = 0;
    local_90.m_logger = (Logger *)0x0;
    local_90.m_proceed = false;
    local_90.m_messageBuilder.m_logger = (Logger *)0x0;
    local_90.m_messageBuilder.m_containerLogSeperator = "";
    local_90.m_dispatchAction = NormalLog;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_90,1,"default");
    bVar1 = pWVar3->m_proceed;
    if ((bool)bVar1 == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"epoll_ctl op = ");
      bVar1 = pWVar3->m_proceed;
    }
    if ((bVar1 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,operation);
      bVar1 = pWVar3->m_proceed;
    }
    if ((bVar1 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder," fd = ");
      bVar1 = pWVar3->m_proceed;
    }
    if ((bVar1 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,__fd);
    }
    el::base::Writer::~Writer(&local_90);
  }
  return;
}

Assistant:

void EPoller::update(int operation, Channel* channel) {
    struct epoll_event event;
    bzero(&event, sizeof(event));
    event.events = channel->events();
    event.data.ptr = channel;
    int fd = channel->fd();
    if (::epoll_ctl(_epollfd, operation, fd, &event) < 0) {
        LOG(FATAL) << "epoll_ctl op = " << operation << " fd = " << fd;
    }
}